

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Glucose::sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(int *array,uint size)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  
  for (; 0xf < (int)size; size = size - (int)uVar5) {
    iVar1 = array[size >> 1];
    uVar5 = 0xffffffffffffffff;
    uVar4 = (ulong)size;
    while( true ) {
      uVar5 = (ulong)(int)uVar5;
      piVar6 = array + uVar5;
      do {
        uVar5 = uVar5 + 1;
        iVar2 = piVar6[1];
        piVar6 = piVar6 + 1;
      } while (iVar2 < iVar1);
      uVar4 = (ulong)(int)uVar4;
      do {
        lVar3 = uVar4 - 1;
        uVar4 = uVar4 - 1;
      } while (iVar1 < array[lVar3]);
      if ((long)uVar4 <= (long)uVar5) break;
      *piVar6 = array[lVar3];
      array[uVar4] = iVar2;
    }
    sort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(array,uVar5 & 0xffffffff);
    array = piVar6;
  }
  selectionSort<Glucose::Lit,Glucose::LessThan_default<Glucose::Lit>>(array,size);
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}